

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

void __thiscall foxxll::request::check_alignment(request *this)

{
  Logger LStack_188;
  
  if ((this->offset_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188,"Offset is not aligned: modulo ",0x1e);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_188," = ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    tlx::Logger::~Logger(&LStack_188);
  }
  if ((this->bytes_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188,"Size is not a multiple of ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_188,", = ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    tlx::Logger::~Logger(&LStack_188);
  }
  if (((ulong)this->buffer_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188,"Buffer is not aligned: modulo ",0x1e);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_188," = ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_188," (",2);
    std::ostream::_M_insert<void_const*>(&LStack_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_188,")",1);
    tlx::Logger::~Logger(&LStack_188);
  }
  return;
}

Assistant:

void request::check_alignment() const
{
    if (offset_ % BlockAlignment != 0)
        TLX_LOG1 << "Offset is not aligned: modulo " <<
            BlockAlignment << " = " << offset_ % BlockAlignment;

    if (bytes_ % BlockAlignment != 0)
        TLX_LOG1 << "Size is not a multiple of " <<
            BlockAlignment << ", = " << bytes_ % BlockAlignment;

    if (size_t(buffer_) % BlockAlignment != 0)
        TLX_LOG1 << "Buffer is not aligned: modulo " <<
            BlockAlignment << " = " << size_t(buffer_) % BlockAlignment <<
            " (" << buffer_ << ")";
}